

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-test.c
# Opt level: O2

uint64_t wait_for_timerfd(int timerfd)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 uStack_20;
  uint64_t timeouts;
  pollfd pfd;
  
  pfd.events = 1;
  pfd.revents = 0;
  pfd.fd = timerfd;
  iVar1 = poll((pollfd *)&pfd,1,-1);
  if (iVar1 == 1) {
    uVar2 = read(timerfd,&timeouts,8);
    if (uVar2 != 8) {
      piVar3 = __errno_location();
      microatf_fail_require
                ("%s:%d: %d %d",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/timerfd-test.c"
                 ,0x5a,uVar2 & 0xffffffff,*piVar3);
    }
    if (timeouts != 0) {
      return timeouts;
    }
    pcVar4 = "timeouts > 0";
    uStack_20 = 0x5b;
  }
  else {
    pcVar4 = "poll(&pfd, 1, -1) == 1";
    uStack_20 = 0x55;
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/timerfd-test.c"
             ,uStack_20,pcVar4);
}

Assistant:

static uint64_t
wait_for_timerfd(int timerfd)
{
	struct pollfd pfd = { .fd = timerfd, .events = POLLIN };

	ATF_REQUIRE(poll(&pfd, 1, -1) == 1);

	uint64_t timeouts;
	ssize_t r = read(timerfd, &timeouts, sizeof(timeouts));

	ATF_REQUIRE_MSG(r == (ssize_t)sizeof(timeouts), "%d %d", (int)r, errno);
	ATF_REQUIRE(timeouts > 0);
	return timeouts;
}